

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadRegion.cpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
ThreadRegion::dotName_abi_cxx11_(ThreadRegion *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_30 [28];
  int in_stack_ffffffffffffffec;
  
  __lhs = in_RDI;
  std::__cxx11::to_string(in_stack_ffffffffffffffec);
  std::operator+((char *)__lhs,in_RDI);
  std::__cxx11::string::~string(local_30);
  return __lhs;
}

Assistant:

std::string ThreadRegion::dotName() { return "cluster" + std::to_string(id_); }